

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

float Abc_NtkMfsTotalGlitching(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gli_Man_t *p_02;
  Abc_Obj_t *pAVar6;
  long *plVar7;
  uint *puTruth;
  long lVar8;
  float fVar9;
  int local_48;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                  ,0x6bb,"float Abc_NtkMfsTotalGlitching(Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkGetFaninMax(pNtk);
  if (iVar2 < 7) {
    iVar2 = Abc_NtkGetFaninMax(pNtk);
    if (iVar2 < 7) {
      Abc_NtkToAig(pNtk);
      p = Abc_NtkDfs(pNtk,0);
      p_00 = Vec_IntAlloc(6);
      p_01 = Vec_IntAlloc(0x1000);
      iVar2 = pNtk->vCis->nSize;
      iVar4 = p->nSize;
      iVar1 = pNtk->vCos->nSize;
      iVar5 = pNtk->nObjCounts[8];
      iVar3 = Abc_NtkGetTotalFanins(pNtk);
      p_02 = Gli_ManAlloc(iVar2 + iVar4 + iVar1,iVar5,iVar3 + pNtk->vCos->nSize);
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pAVar6 = Abc_NtkObj(pNtk,iVar2);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          (pAVar6->field_6).iTemp = -1;
        }
      }
      for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
        pAVar6 = Abc_NtkCi(pNtk,iVar2);
        iVar4 = Gli_ManCreateCi(p_02,(pAVar6->vFanouts).nSize);
        (pAVar6->field_6).iTemp = iVar4;
      }
      for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
        plVar7 = (long *)Vec_PtrEntry(p,iVar2);
        p_00->nSize = 0;
        for (lVar8 = 0; lVar8 < *(int *)((long)plVar7 + 0x1c); lVar8 = lVar8 + 1) {
          Vec_IntPush(p_00,*(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                             (long)*(int *)(plVar7[4] + lVar8 * 4) * 8) + 0x40));
        }
        puTruth = Hop_ManConvertAigToTruth
                            ((Hop_Man_t *)pNtk->pManFunc,(Hop_Obj_t *)plVar7[7],
                             *(int *)((long)plVar7 + 0x1c),p_01,0);
        iVar4 = Gli_ManCreateNode(p_02,p_00,*(int *)((long)plVar7 + 0x2c),puTruth);
        *(int *)(plVar7 + 8) = iVar4;
      }
      for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
        pAVar6 = Abc_NtkCo(pNtk,iVar2);
        Gli_ManCreateCo(p_02,*(int *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] +
                                     0x40));
      }
      iVar4 = 0;
      Gli_ManSwitchesAndGlitches(p_02,4000,0.125,0);
      local_48 = 0;
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pAVar6 = Abc_NtkObj(pNtk,iVar2);
        if ((pAVar6 != (Abc_Obj_t *)0x0) && (-1 < (pAVar6->field_6).iTemp)) {
          iVar1 = (pAVar6->vFanouts).nSize;
          iVar5 = Gli_ObjNumSwitches(p_02,(pAVar6->field_6).iTemp);
          local_48 = local_48 + iVar5 * iVar1;
          iVar1 = (pAVar6->vFanouts).nSize;
          iVar5 = Gli_ObjNumGlitches(p_02,(pAVar6->field_6).iTemp);
          iVar4 = iVar4 + iVar5 * iVar1;
        }
      }
      Gli_ManStop(p_02);
      Vec_PtrFree(p);
      Vec_IntFree(p_01);
      Vec_IntFree(p_00);
      if (local_48 == 0) {
        fVar9 = 0.0;
      }
      else {
        fVar9 = ((float)(iVar4 - local_48) * 100.0) / (float)local_48;
      }
    }
    else {
      puts(
          "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs."
          );
      fVar9 = -1.0;
    }
    return fVar9;
  }
  __assert_fail("Abc_NtkGetFaninMax(pNtk) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                ,0x6bc,"float Abc_NtkMfsTotalGlitching(Abc_Ntk_t *)");
}

Assistant:

float Abc_NtkMfsTotalGlitching( Abc_Ntk_t * pNtk )
{
    int nSwitches, nGlitches;
    Gli_Man_t * p;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vFanins, * vTruth;
    Abc_Obj_t * pObj, * pFanin;
    unsigned * puTruth;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkGetFaninMax(pNtk) <= 6 );
    if ( Abc_NtkGetFaninMax(pNtk) > 6 )
    {
        printf( "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs.\n" );
        return -1.0;
    }
    Abc_NtkToAig( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 0 );
    vFanins = Vec_IntAlloc( 6 );
    vTruth = Vec_IntAlloc( 1 << 12 );

    // derive network for glitch computation
    p = Gli_ManAlloc( Vec_PtrSize(vNodes) + Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk),
        Abc_NtkLatchNum(pNtk), Abc_NtkGetTotalFanins(pNtk) + Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->iTemp = -1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Gli_ManCreateCi( p, Abc_ObjFanoutNum(pObj) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntClear( vFanins );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vFanins, pFanin->iTemp );
        puTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, 0 );
        pObj->iTemp = Gli_ManCreateNode( p, vFanins, Abc_ObjFanoutNum(pObj), puTruth );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gli_ManCreateCo( p, Abc_ObjFanin0(pObj)->iTemp );

    // compute glitching
    Gli_ManSwitchesAndGlitches( p, 4000, 1.0/8.0, 0 );

    // compute the ratio
    nSwitches = nGlitches = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->iTemp >= 0 )
        {
            nSwitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumSwitches(p, pObj->iTemp);
            nGlitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumGlitches(p, pObj->iTemp);
        }

    Gli_ManStop( p );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTruth );
    Vec_IntFree( vFanins );
    return nSwitches ? 100.0*(nGlitches-nSwitches)/nSwitches : 0.0;
}